

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSymm.c
# Opt level: O0

void Ntk_SymFunGenerate(int nVars,int fVerbose)

{
  int nEntrySize;
  uint uVar1;
  word *pFun_00;
  word wVar2;
  char local_a8 [8];
  char Ones [100];
  word *pFun;
  Vec_Mem_t *vTtMem;
  int *pComp;
  int local_18;
  int Class;
  int m;
  int k;
  int fVerbose_local;
  int nVars_local;
  
  m = fVerbose;
  k = nVars;
  vTtMem = (Vec_Mem_t *)Extra_GreyCodeSchedule(nVars);
  nEntrySize = Abc_Truth6WordNum(k);
  pFun = (word *)Vec_MemAlloc(nEntrySize,0xc);
  Vec_MemHashAlloc((Vec_Mem_t *)pFun,10000);
  if ((0 < k) && (k < 0x11)) {
    printf("Generating truth tables of all symmetric functions of %d variables.\n");
    for (local_18 = 0; local_18 < 1 << ((char)k + 1U & 0x1f); local_18 = local_18 + 1) {
      memset(local_a8,0,100);
      for (Class = 0; Class <= k; Class = Class + 1) {
        local_a8[Class] = ((byte)(local_18 >> ((byte)Class & 0x1f)) & 1) + 0x30;
      }
      if (m != 0) {
        printf("%s : ",local_a8);
      }
      pFun_00 = Abc_TtSymFunGenerate(local_a8,k);
      if (k < 6) {
        wVar2 = Abc_Tt6Stretch(*pFun_00,k);
        *pFun_00 = wVar2;
      }
      if (m != 0) {
        Extra_PrintHex(_stdout,(uint *)pFun_00,k);
      }
      Ntk_SymFunDeriveNpn(pFun_00,k,&vTtMem->nEntrySize);
      pComp._4_4_ = Vec_MemHashInsert((Vec_Mem_t *)pFun,pFun_00);
      if (m != 0) {
        printf(" : NPN ");
        Extra_PrintHex(_stdout,(uint *)pFun_00,k);
        printf("  Class %3d");
        printf("\n");
      }
      if (pFun_00 != (word *)0x0) {
        free(pFun_00);
      }
    }
    uVar1 = Vec_MemEntryNum((Vec_Mem_t *)pFun);
    printf("The number of different NPN classes is %d.\n",(ulong)uVar1);
    Vec_MemHashFree((Vec_Mem_t *)pFun);
    Vec_MemFreeP((Vec_Mem_t **)&pFun);
    if (vTtMem != (Vec_Mem_t *)0x0) {
      free(vTtMem);
    }
    return;
  }
  __assert_fail("!(nVars < 1 || nVars > 16)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSymm.c"
                ,0x13a,"void Ntk_SymFunGenerate(int, int)");
}

Assistant:

void Ntk_SymFunGenerate( int nVars, int fVerbose )
{
    int k, m, Class;
    int * pComp = Extra_GreyCodeSchedule( nVars );
    Vec_Mem_t * vTtMem = Vec_MemAlloc( Abc_Truth6WordNum(nVars), 12 );
    Vec_MemHashAlloc( vTtMem, 10000 );
    assert( !(nVars < 1 || nVars > 16) );
    printf( "Generating truth tables of all symmetric functions of %d variables.\n", nVars );
    for ( m = 0; m < (1 << (nVars+1)); m++ )
    {
        word * pFun;
        char Ones[100] = {0};
        for ( k = 0; k <= nVars; k++ )
            Ones[k] = '0' + ((m >> k) & 1);
        if ( fVerbose )
            printf( "%s : ", Ones );
        pFun = Abc_TtSymFunGenerate( Ones, nVars );
        if ( nVars < 6 )
            pFun[0] = Abc_Tt6Stretch( pFun[0], nVars );
        if ( fVerbose )
            Extra_PrintHex( stdout, (unsigned *)pFun, nVars );
        Ntk_SymFunDeriveNpn( pFun, nVars, pComp );
        Class = Vec_MemHashInsert( vTtMem, pFun );
        if ( fVerbose )
        {
            printf( " : NPN " );
            Extra_PrintHex( stdout, (unsigned *)pFun, nVars );
            printf( "  Class %3d", Class );
            printf( "\n" );
        }
        ABC_FREE( pFun );
    }
    printf( "The number of different NPN classes is %d.\n", Vec_MemEntryNum(vTtMem) );
    Vec_MemHashFree( vTtMem );
    Vec_MemFreeP( &vTtMem );
    ABC_FREE( pComp );
}